

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_node.cpp
# Opt level: O3

void __thiscall
OperatorNode::Act(OperatorNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  uint uVar1;
  _Elt_pointer pdVar2;
  int i;
  uint uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double res;
  void *local_48;
  iterator iStack_40;
  double *local_38;
  double local_30;
  
  local_48 = (void *)0x0;
  iStack_40._M_current = (double *)0x0;
  local_38 = (double *)0x0;
  uVar3 = 0;
  while( true ) {
    uVar1 = (*this->operation_->_vptr_IOperation[2])();
    if (uVar1 <= uVar3) break;
    pdVar2 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pdVar2 == (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pdVar2 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (iStack_40._M_current == local_38) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_48,iStack_40,pdVar2 + -1);
    }
    else {
      *iStack_40._M_current = pdVar2[-1];
      iStack_40._M_current = iStack_40._M_current + 1;
    }
    std::deque<double,_std::allocator<double>_>::pop_back(&s->c);
    uVar3 = uVar3 + 1;
  }
  (*this->operation_->_vptr_IOperation[1])(this->operation_,&local_48);
  pdVar2 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (pdVar2 == (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
              ((deque<double,std::allocator<double>> *)s,&local_30);
  }
  else {
    *pdVar2 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = pdVar2 + 1;
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void OperatorNode::Act(std::stack<double> &s) const {
  std::vector<double> args{};
  for (int i = 0; i < operation_->GetArity(); i++) {
    // TODO: check stack. If it's empty - throw exception.
    args.push_back(s.top());
    s.pop();
  }
  auto res = operation_->Apply(args);
  s.push(res);
}